

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::VideoTrack::SetStereoMode(VideoTrack *this,uint64_t stereo_mode)

{
  uint64_t stereo_mode_local;
  VideoTrack *this_local;
  bool local_1;
  
  if ((((stereo_mode == 0) || (stereo_mode == 1)) || (stereo_mode == 2)) ||
     ((stereo_mode == 3 || (stereo_mode == 0xb)))) {
    this->stereo_mode_ = stereo_mode;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VideoTrack::SetStereoMode(uint64_t stereo_mode) {
  if (stereo_mode != kMono && stereo_mode != kSideBySideLeftIsFirst &&
      stereo_mode != kTopBottomRightIsFirst &&
      stereo_mode != kTopBottomLeftIsFirst &&
      stereo_mode != kSideBySideRightIsFirst)
    return false;

  stereo_mode_ = stereo_mode;
  return true;
}